

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O0

int cppcms_capi_session_init(cppcms_capi_session *session,cppcms_capi_session_pool *pool)

{
  logic_error *plVar1;
  session_pool *psVar2;
  session_interface *p;
  long in_RSI;
  long in_RDI;
  session_interface_cookie_adapter *in_stack_00000020;
  session_pool *in_stack_00000028;
  session_interface *in_stack_00000030;
  hold_ptr<cppcms::session_interface> *in_stack_ffffffffffffffc0;
  int local_4;
  
  if (in_RDI == 0) {
    local_4 = -1;
  }
  else {
    if (in_RSI == 0) {
      plVar1 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(plVar1,"pool is NULL");
      __cxa_throw(plVar1,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    psVar2 = booster::hold_ptr<cppcms::session_pool>::get
                       ((hold_ptr<cppcms::session_pool> *)(in_RSI + 0x70));
    if (psVar2 == (session_pool *)0x0) {
      plVar1 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(plVar1,"Session pool is not initialized");
      __cxa_throw(plVar1,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    p = (session_interface *)operator_new(0xc0);
    booster::hold_ptr<cppcms::session_pool>::operator*
              ((hold_ptr<cppcms::session_pool> *)(in_RSI + 0x70));
    cppcms::session_interface::session_interface
              (in_stack_00000030,in_stack_00000028,in_stack_00000020);
    booster::hold_ptr<cppcms::session_interface>::reset(in_stack_ffffffffffffffc0,p);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int cppcms_capi_session_init(cppcms_capi_session *session,cppcms_capi_session_pool *pool)
{
	TRY {
		if(!session)
			return -1;
		if(!pool)
			throw std::logic_error("pool is NULL");
		if(!pool->p.get()) {
			throw std::logic_error("Session pool is not initialized");
		}
		session->p.reset(new cppcms::session_interface(*pool->p,session->adapter));
	}